

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editline.c
# Opt level: O0

int read_history(char *filename)

{
  FILE *__stream;
  char *pcVar1;
  size_t sVar2;
  undefined8 uStack_130;
  char local_128 [8];
  char buf [256];
  FILE *fp;
  char *filename_local;
  
  uStack_130 = 0x12cb54;
  hist_alloc();
  uStack_130 = 0x12cb64;
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    filename_local._4_4_ = -1;
  }
  else {
    H.Size = 0;
    while (H.Size < el_hist_size) {
      uStack_130 = 0x12cba5;
      pcVar1 = fgets(local_128,0x100,__stream);
      if (pcVar1 == (char *)0x0) break;
      uStack_130 = 0x12cbb9;
      sVar2 = strlen(local_128);
      local_128[sVar2 - 1] = '\0';
      uStack_130 = 0x12cbd1;
      add_history(local_128);
    }
    uStack_130 = 0x12cbdc;
    filename_local._4_4_ = fclose(__stream);
  }
  return filename_local._4_4_;
}

Assistant:

int read_history(const char *filename)
{
    FILE *fp;
    char buf[SCREEN_INC];

    hist_alloc();

    fp = fopen(filename, "r");
    if (!fp)
	return EOF;

    H.Size = 0;
    while (H.Size < el_hist_size) {
	if (!fgets(buf, SCREEN_INC, fp))
	    break;

	buf[strlen(buf) - 1] = 0; /* Remove '\n' */
	add_history(buf);
    }

    return fclose(fp);
}